

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::pp_if(CTcTokenizer *this)

{
  int iVar1;
  CTcConstVal val;
  
  val.typ_ = TC_CVT_UNK;
  val._32_1_ = 0;
  iVar1 = expand_macros_curline(this,0,1,0);
  clear_linebuf(this);
  if (iVar1 != 0) {
    push_if(this,TOKIF_IF_YES);
    return;
  }
  this->curbuf_ = &this->expbuf_;
  (this->p_).p_ = (this->expbuf_).buf_;
  iVar1 = pp_parse_expr(this,&val,1,1,1);
  if (iVar1 != 0) {
    val.typ_ = TC_CVT_TRUE;
  }
  iVar1 = CTcConstVal::get_val_bool(&val);
  push_if(this,(iVar1 == 0) + TOKIF_IF_YES);
  return;
}

Assistant:

void CTcTokenizer::pp_if()
{
    CTcConstVal val;
    
    /* expand macros; don't allow reading additional lines */
    if (expand_macros_curline(FALSE, TRUE, FALSE))
        goto do_error;

    /* 
     *   we don't need the original source line any more, and we don't
     *   want to copy it to the preprocessed output, so clear it 
     */
    clear_linebuf();

    /* parse out of the expansion buffer */
    start_new_line(&expbuf_, 0);

    /* parse the preprocessor expression */
    if (pp_parse_expr(&val, TRUE, TRUE, TRUE))
    {
        /* 
         *   we can't get a value; treat the expression as true and
         *   continue parsing, so that we don't throw off the #if nesting
         *   level 
         */
        val.set_bool(TRUE);
    }

    /* push the new state according to the value of the expression */
    push_if(val.get_val_bool() ? TOKIF_IF_YES : TOKIF_IF_NO);

    /* done */
    return;

do_error:
    /* clear the line buffer */
    clear_linebuf();

    /* 
     *   push a true if - even though we can't evaluate the condition, we
     *   can at least avoid a cascade of errors for the matching #endif
     *   and #else 
     */
    push_if(TOKIF_IF_YES);
}